

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_ALTER_REALITY(effect_handler_context_t_conflict *context)

{
  if (player->upkeep->arena_level == false) {
    msg("The world changes!");
    dungeon_change_level(player,(int)player->depth);
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_ALTER_REALITY(effect_handler_context_t *context)
{
	/* Don't allow in single combat arenas. */
	if (player->upkeep->arena_level) return true;
	msg("The world changes!");
	dungeon_change_level(player, player->depth);
	context->ident = true;
	return true;
}